

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O0

void __thiscall
MxxSort_BitonicSort1_Test::MxxSort_BitonicSort1_Test(MxxSort_BitonicSort1_Test *this)

{
  MxxSort_BitonicSort1_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__MxxSort_BitonicSort1_Test_0019bc98;
  return;
}

Assistant:

TEST(MxxSort, BitonicSort1) {
    mxx::comm c;
    // simple sorting test with same number of elements for each processor
    std::vector<int> vec(250);
    srand(133*c.rank());
    std::generate(vec.begin(), vec.end(), [](){ return std::rand() % 100;});

    // sort
    mxx::bitonic_sort(vec.begin(), vec.end(), std::less<int>(), c);

    // should be locally sorted
    ASSERT_TRUE(std::is_sorted(vec.begin(), vec.end()));

    // first element on each proc should be larger or equal to last one on
    // previous processor
    int prev = mxx::right_shift(vec.back(), c);
    if (c.rank() > 0) {
        ASSERT_TRUE(prev <= vec.front());
    }

    // assume is sorted
    bool sorted = mxx::is_sorted(vec.begin(), vec.end(), std::less<int>(), c);
    ASSERT_EQ(true, sorted);
}